

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

DirectionCone * __thiscall
pbrt::Disk::NormalBounds(DirectionCone *__return_storage_ptr__,Disk *this)

{
  bool bVar1;
  undefined1 in_ZMM0 [64];
  undefined1 auVar3 [56];
  undefined1 auVar2 [64];
  Normal3<float> NVar4;
  Vector3f w;
  Tuple3<pbrt::Normal3,_float> local_20;
  
  auVar3 = in_ZMM0._8_56_;
  local_20.x = 0.0;
  local_20.y = 0.0;
  local_20.z = 1.0;
  NVar4 = Transform::operator()(this->renderFromObject,(Normal3<float> *)&local_20);
  auVar2._0_8_ = NVar4.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar2._8_56_ = auVar3;
  bVar1 = this->reverseOrientation;
  if (bVar1 != false) {
    auVar2 = ZEXT1664(CONCAT412(auVar3._4_4_ ^ 0x80000000,
                                CONCAT48(auVar3._0_4_ ^ 0x80000000,auVar2._0_8_ ^ 0x8000000080000000
                                        )));
  }
  w.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar2._0_8_;
  w.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)((uint)(bVar1 & 1) * (int)-NVar4.super_Tuple3<pbrt::Normal3,_float>.z +
              (uint)!(bool)(bVar1 & 1) * (int)NVar4.super_Tuple3<pbrt::Normal3,_float>.z);
  DirectionCone::DirectionCone(__return_storage_ptr__,w);
  return __return_storage_ptr__;
}

Assistant:

DirectionCone Disk::NormalBounds() const {
    Normal3f n = (*renderFromObject)(Normal3f(0, 0, 1));
    if (reverseOrientation)
        n = -n;
    return DirectionCone(Vector3f(n));
}